

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

size_t coda_revxspn(char *s,char *n,size_t len)

{
  long lVar1;
  bool bVar2;
  __int32_t **pp_Var3;
  char *pcVar4;
  char cVar5;
  long lVar6;
  
  lVar1 = len - 1;
  pcVar4 = n;
  lVar6 = lVar1;
  if (0 < (long)len) {
    do {
      if (*pcVar4 == '\0') goto LAB_0010557e;
      cVar5 = *n;
      pcVar4 = n;
      if (cVar5 != '\0') {
        pp_Var3 = __ctype_tolower_loc();
        do {
          if ((*pp_Var3)[s[lVar6]] == (*pp_Var3)[cVar5]) break;
          cVar5 = pcVar4[1];
          pcVar4 = pcVar4 + 1;
        } while (cVar5 != '\0');
      }
      bVar2 = 0 < lVar6;
      lVar6 = lVar6 + -1;
    } while (bVar2);
    lVar6 = -1;
  }
LAB_0010557e:
  return lVar1 - lVar6;
}

Assistant:

size_t coda_revxspn(const char *s, const char *n, size_t len)
{
	const char *b = s - 1;
	const char *p = s - 1 + len;
	const char *x = n;

	for (; p > b && *x; --p)
	{
		for (x = n; *x; ++x)
		{
			if (tolower(*p) == tolower(*x)) break;
		}
	}

	return s - 1 + len - p;
}